

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax*,slang::ast::ASTContext>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          Symbol **args_1,tuple<slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *args_2
          )

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  group_type_pointer pgVar3;
  ulong uVar4;
  uint uVar5;
  ushort uVar6;
  underlying_type uVar7;
  Symbol *pSVar8;
  TempVarSymbol *pTVar9;
  RandomizeDetails *pRVar10;
  _Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *p_Var11;
  SymbolIndex SVar12;
  undefined4 uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  pgVar3 = arrays_->groups_;
  lVar14 = pos0 * 0x10;
  pgVar1 = pgVar3 + pos0;
  auVar17[0] = -(pgVar1->m[0].n == '\0');
  auVar17[1] = -(pgVar1->m[1].n == '\0');
  auVar17[2] = -(pgVar1->m[2].n == '\0');
  auVar17[3] = -(pgVar1->m[3].n == '\0');
  auVar17[4] = -(pgVar1->m[4].n == '\0');
  auVar17[5] = -(pgVar1->m[5].n == '\0');
  auVar17[6] = -(pgVar1->m[6].n == '\0');
  auVar17[7] = -(pgVar1->m[7].n == '\0');
  auVar17[8] = -(pgVar1->m[8].n == '\0');
  auVar17[9] = -(pgVar1->m[9].n == '\0');
  auVar17[10] = -(pgVar1->m[10].n == '\0');
  auVar17[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar17[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar17[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar17[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar17[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar15 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
  if (uVar15 == 0) {
    uVar4 = arrays_->groups_size_mask;
    lVar16 = 1;
    do {
      pgVar3[pos0].m[0xf].n = pgVar3[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar16 & uVar4;
      lVar14 = pos0 * 0x10;
      pgVar1 = pgVar3 + pos0;
      auVar18[0] = -(pgVar1->m[0].n == '\0');
      auVar18[1] = -(pgVar1->m[1].n == '\0');
      auVar18[2] = -(pgVar1->m[2].n == '\0');
      auVar18[3] = -(pgVar1->m[3].n == '\0');
      auVar18[4] = -(pgVar1->m[4].n == '\0');
      auVar18[5] = -(pgVar1->m[5].n == '\0');
      auVar18[6] = -(pgVar1->m[6].n == '\0');
      auVar18[7] = -(pgVar1->m[7].n == '\0');
      auVar18[8] = -(pgVar1->m[8].n == '\0');
      auVar18[9] = -(pgVar1->m[9].n == '\0');
      auVar18[10] = -(pgVar1->m[10].n == '\0');
      auVar18[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar18[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar18[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar18[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar18[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar6 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe;
      uVar15 = (uint)uVar6;
      lVar16 = lVar16 + 1;
    } while (uVar6 == 0);
  }
  uVar5 = 0;
  if (uVar15 != 0) {
    for (; (uVar15 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
    }
  }
  ppVar2 = arrays_->elements_ + pos0 * 0xf + (ulong)uVar5;
  ppVar2->first = *args_1;
  SVar12 = (args_2->
           super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
           super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
  uVar13 = *(undefined4 *)
            &(args_2->
             super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
             super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
  uVar7 = (args_2->
          super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
          super__Tuple_impl<1UL,_slang::ast::ASTContext>.
          super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
  pSVar8 = (args_2->
           super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
           super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
  pTVar9 = (args_2->
           super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
           super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
  pRVar10 = (args_2->
            super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
            super__Tuple_impl<1UL,_slang::ast::ASTContext>.
            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
       (args_2->super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>)
       .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
  p_Var11 = &(ppVar2->second).
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
  ;
  (p_Var11->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex = SVar12;
  *(undefined4 *)
   &(p_Var11->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
    super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc = uVar13;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits = uVar7;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc = pSVar8;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar = pTVar9;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails = pRVar10;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
       (args_2->super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>)
       .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
  (ppVar2->second).
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
       (args_2->super__Tuple_impl<0UL,_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>)
       .super__Head_base<0UL,_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl;
  (pgVar3->m + lVar14)[uVar5].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar3->m + lVar14);
  __return_storage_ptr__->n = uVar5;
  __return_storage_ptr__->p = ppVar2;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }